

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O2

Variant * __thiscall cali::Variant::min(Variant *this,Variant *val)

{
  double dVar1;
  char cVar2;
  anon_union_8_7_33918203_for_value aVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  cVar2 = (char)(this->m_v).type_and_size;
  if ((char)(val->m_v).type_and_size == cVar2) {
    if (cVar2 != '\x02') {
      if (cVar2 != '\x03') {
        if (cVar2 != '\x06') {
          return this;
        }
        dVar6 = (val->m_v).value.v_double;
        goto LAB_001bf79f;
      }
      uVar4 = (val->m_v).value.v_uint;
      goto LAB_001bf7af;
    }
    uVar4 = (val->m_v).value.v_int;
LAB_001bf7c0:
    uVar5 = (this->m_v).value.v_int;
    if ((long)uVar4 < (long)uVar5) {
      uVar5 = uVar4;
    }
LAB_001bf7cb:
    (this->m_v).value.v_int = uVar5;
  }
  else {
    switch(cVar2) {
    case '\0':
      aVar3 = (val->m_v).value;
      (this->m_v).type_and_size = (val->m_v).type_and_size;
      (this->m_v).value = aVar3;
      break;
    case '\x02':
      uVar4 = to_int64(val,(bool *)0x0);
      goto LAB_001bf7c0;
    case '\x03':
      uVar4 = to_uint(val,(bool *)0x0);
LAB_001bf7af:
      uVar5 = (this->m_v).value.v_uint;
      if (uVar4 < uVar5) {
        uVar5 = uVar4;
      }
      goto LAB_001bf7cb;
    case '\x06':
      dVar6 = to_double(val,(bool *)0x0);
LAB_001bf79f:
      dVar1 = (this->m_v).value.v_double;
      if (dVar1 <= dVar6) {
        dVar6 = dVar1;
      }
      (this->m_v).value.v_double = dVar6;
    }
  }
  return this;
}

Assistant:

Variant& Variant::min(const Variant& val)
{
    cali_attr_type type = this->type();

    if (type == val.type()) {
        switch (type) {
        case CALI_TYPE_DOUBLE:
            m_v.value.v_double = std::min(m_v.value.v_double, val.m_v.value.v_double);
            break;
        case CALI_TYPE_INT:
            m_v.value.v_int = std::min(m_v.value.v_int, val.m_v.value.v_int);
            break;
        case CALI_TYPE_UINT:
            m_v.value.v_uint = std::min(m_v.value.v_uint, val.m_v.value.v_uint);
            break;
        default:
            break;
        }
    } else {
        switch (type) {
        case CALI_TYPE_INV:
            *this = val;
            break;
        case CALI_TYPE_DOUBLE:
            m_v.value.v_double = std::min(m_v.value.v_double, val.to_double());
            break;
        case CALI_TYPE_INT:
            m_v.value.v_int = std::min(m_v.value.v_int, val.to_int64());
            break;
        case CALI_TYPE_UINT:
            m_v.value.v_uint = std::min(m_v.value.v_uint, val.to_uint());
            break;
        default:
            break;
        }
    }

    return *this;
}